

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall
ON_Brep::IsCorrupt(ON_Brep *this,bool bRepair,bool bSilentError,ON_TextLog *text_log)

{
  ON_BrepVertex *pOVar1;
  ON_BrepEdge *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *pOVar5;
  int iVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  long lVar8;
  undefined7 in_register_00000031;
  ulong text_log_ptr_plus;
  bool bCorrupt;
  uint local_70;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  uint local_54;
  ulong local_50;
  int local_44;
  int local_40;
  int local_3c;
  ON_Brep *ignored_this_ptr;
  
  bCorrupt = false;
  local_40 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_44 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_3c = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  local_54 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
             m_count;
  local_60 = CONCAT44(local_60._4_4_,
                      (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>
                      .m_count);
  local_70 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  local_6c = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  local_50 = (ulong)(uint)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                          super_ON_ClassArray<ON_BrepFace>.m_count;
  uVar7 = CONCAT71(in_register_00000011,bSilentError) & 0xffffffff | (ulong)text_log;
  text_log_ptr_plus = uVar7 | 2;
  if ((int)CONCAT71(in_register_00000031,bRepair) == 0) {
    text_log_ptr_plus = uVar7;
  }
  uVar7 = 0;
  local_68 = 0;
  if (0 < (int)local_54) {
    local_68 = (ulong)local_54;
  }
  lVar8 = 0x34;
  ignored_this_ptr = this;
  for (; local_68 != uVar7; uVar7 = uVar7 + 1) {
    pOVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    Internal_ValidateBrepComponentBackPtr
              (text_log_ptr_plus,L"Corrupt ON_BrepVertex.m_vertex_index back pointer.\n",&bCorrupt,
               this,&ignored_this_ptr,(int)uVar7,
               (int *)((long)&(pOVar1->super_ON_Point).super_ON_Geometry.super_ON_Object.
                              _vptr_ON_Object + lVar8));
    Internal_ValidateBrepIndexSimpleArray
              (text_log_ptr_plus,L"Corrupt ON_BrepVertex.m_ei[] index.\n",&bCorrupt,(int)local_60,
               (ON_SimpleArray<int> *)
               ((long)&(pOVar1->super_ON_Point).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
               lVar8 + 4));
    lVar8 = lVar8 + 0x58;
  }
  uVar7 = 0;
  local_68 = 0;
  if (0 < (int)local_60) {
    local_68 = local_60 & 0xffffffff;
  }
  lVar8 = 0x80;
  for (; local_68 != uVar7; uVar7 = uVar7 + 1) {
    pOVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    Internal_ValidateBrepComponentBackPtr
              (text_log_ptr_plus,L"Corrupt ON_BrepEdge m_brep or m_edge_index back pointers.\n",
               &bCorrupt,this,
               (ON_Brep **)
               ((long)&(((ON_CurveProxy *)(&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2))
                       ->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar8),
               (int)uVar7,
               (int *)((long)(pOVar2->super_ON_CurveProxy).m_real_curve_domain.m_t + lVar8 + -0x54))
    ;
    Internal_ValidateBrepIndexArray
              (text_log_ptr_plus,L"Corrupt ON_BrepEdge.m_vi[] index.\n",&bCorrupt,local_54,2,
               (int *)((long)(pOVar2->super_ON_CurveProxy).m_real_curve_domain.m_t + lVar8 + -0x4c))
    ;
    Internal_ValidateBrepIndex
              (text_log_ptr_plus,L"Corrupt ON_BrepEdge.m_c3i index.\n",&bCorrupt,local_44,
               (int *)((long)(&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -5) + lVar8));
    Internal_ValidateBrepIndexSimpleArray
              (text_log_ptr_plus,L"Corrupt ON_BrepEdge.m_ti[] index.\n",&bCorrupt,local_70,
               (ON_SimpleArray<int> *)
               ((long)(&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -4) + lVar8));
    lVar8 = lVar8 + 0x88;
  }
  uVar7 = 0;
  local_68 = 0;
  if (0 < (int)local_70) {
    local_68 = (ulong)local_70;
  }
  lVar8 = 0xe0;
  for (; local_68 != uVar7; uVar7 = uVar7 + 1) {
    pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    Internal_ValidateBrepComponentBackPtr
              (text_log_ptr_plus,L"Corrupt ON_BrepTrim m_brep or m_trim_index back pointers.\n",
               &bCorrupt,this,
               (ON_Brep **)
               ((long)&(((ON_CurveProxy *)(&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))
                       ->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar8),
               (int)uVar7,(int *)((long)pOVar3 + lVar8 + -0x94));
    Internal_ValidateBrepIndex
              (text_log_ptr_plus,L"Corrupt ON_BrepTrim.m_c2i index.\n",&bCorrupt,local_40,
               (int *)((long)pOVar3 + lVar8 + -0x90));
    Internal_ValidateBrepIndex
              (text_log_ptr_plus,L"Corrupt ON_BrepTrim.m_ei index.\n",&bCorrupt,(int)local_60,
               (int *)((long)pOVar3 + lVar8 + -0x8c));
    Internal_ValidateBrepIndex
              (text_log_ptr_plus,L"Corrupt ON_BrepTrim.m_li index.\n",&bCorrupt,local_6c,
               (int *)((long)pOVar3 + lVar8 + -0x74));
    Internal_ValidateBrepIndexArray
              (text_log_ptr_plus,L"Corrupt ON_BrepTrim.m_vi[] index.\n",&bCorrupt,local_54,2,
               (int *)((long)pOVar3 + lVar8 + -0x88));
    lVar8 = lVar8 + 0xe8;
  }
  uVar7 = 0;
  local_60 = 0;
  if (0 < (int)local_6c) {
    local_60 = (ulong)local_6c;
  }
  lVar8 = 0x70;
  for (; local_60 != uVar7; uVar7 = uVar7 + 1) {
    pOVar4 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    Internal_ValidateBrepComponentBackPtr
              (text_log_ptr_plus,L"Corrupt ON_BrepLoop m_brep or m_loop_index back pointers.\n",
               &bCorrupt,this,
               (ON_Brep **)
               ((long)&(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object + lVar8),
               (int)uVar7,(int *)((long)pOVar4 + lVar8 + -0x54));
    Internal_ValidateBrepIndexSimpleArray
              (text_log_ptr_plus,L"Corrupt ON_BrepLoop.m_ti[] index.\n",&bCorrupt,local_70,
               (ON_SimpleArray<int> *)((long)pOVar4 + lVar8 + -0x50));
    Internal_ValidateBrepIndex
              (text_log_ptr_plus,L"Corrupt ON_BrepLoop.m_fi index.\n",&bCorrupt,(int)local_50,
               (int *)((long)pOVar4 + lVar8 + -0x34));
    lVar8 = lVar8 + 0x78;
  }
  uVar7 = 0;
  iVar6 = (int)local_50;
  local_50 = local_50 & 0xffffffff;
  if (iVar6 < 1) {
    local_50 = uVar7;
  }
  lVar8 = 0xd0;
  for (; local_50 != uVar7; uVar7 = uVar7 + 1) {
    pOVar5 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    Internal_ValidateBrepComponentBackPtr
              (text_log_ptr_plus,L"Corrupt ON_BrepFace m_brep or m_face_index back pointers.\n",
               &bCorrupt,this,(ON_Brep **)((pOVar5->m_face_uuid).Data4 + lVar8 + -0x5c),(int)uVar7,
               (int *)((long)pOVar5 + lVar8 + -0xa4));
    Internal_ValidateBrepIndexSimpleArray
              (text_log_ptr_plus,L"Corrupt ON_BrepFace.m_li[] index.\n",&bCorrupt,local_6c,
               (ON_SimpleArray<int> *)((long)pOVar5 + lVar8 + -0xa0));
    Internal_ValidateBrepIndex
              (text_log_ptr_plus,L"Corrupt ON_BrepFace.m_si index.\n",&bCorrupt,local_3c,
               (int *)((long)pOVar5 + lVar8 + -0x88));
    lVar8 = lVar8 + 0xd8;
  }
  return bCorrupt;
}

Assistant:

bool ON_Brep::IsCorrupt(
  bool bRepair,
  bool bSilentError,
  class ON_TextLog* text_log
) const
{
  bool bCorrupt = false;

  const int C2_count = m_C2.Count();
  const int C3_count = m_C3.Count();
  const int S_count = m_S.Count();
  const int V_count = m_V.Count();
  const int E_count = m_E.Count();
  const int T_count = m_T.Count();
  const int L_count = m_L.Count();
  const int F_count = m_F.Count();

  ON__UINT_PTR text_log_ptr = (ON__UINT_PTR)text_log;
  if (bSilentError)
    text_log_ptr |= 1;
  if (bRepair)
    text_log_ptr |= 2;

  ON_Brep* ignored_this_ptr = const_cast<ON_Brep*>(this);

  for (int vi = 0; vi < V_count; vi++)
  {
    const ON_BrepVertex& v = m_V[vi];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepVertex.m_vertex_index back pointer.\n",
      bCorrupt,
      this, &ignored_this_ptr,
      vi, v.m_vertex_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepVertex.m_ei[] index.\n",
      bCorrupt,
      E_count,
      v.m_ei
    );
  }
  
  for (int ei = 0; ei < E_count; ei++)
  {
    const ON_BrepEdge& e = m_E[ei];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepEdge m_brep or m_edge_index back pointers.\n",
      bCorrupt,
      this, &e.m_brep,
      ei, e.m_edge_index
    );

    Internal_ValidateBrepIndexArray(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_vi[] index.\n",
      bCorrupt,
      V_count,
      2,
      e.m_vi
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_c3i index.\n",
      bCorrupt,
      C3_count,
      e.m_c3i
    );
    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_ti[] index.\n",
      bCorrupt,
      T_count,
      e.m_ti
    );
  }
  
  for (int ti = 0; ti < T_count; ti++)
  {
    const ON_BrepTrim& t = m_T[ti];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepTrim m_brep or m_trim_index back pointers.\n",
      bCorrupt,
      this, &t.m_brep,
      ti, t.m_trim_index
    );

    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_c2i index.\n",
      bCorrupt,
      C2_count,
      t.m_c2i
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_ei index.\n",
      bCorrupt,
      E_count,
      t.m_ei
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_li index.\n",
      bCorrupt,
      L_count,
      t.m_li
    );
    Internal_ValidateBrepIndexArray(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_vi[] index.\n",
      bCorrupt,
      V_count,
      2,
      t.m_vi
    );
  }
  
  for (int li = 0; li < L_count; li++)
  {
    const ON_BrepLoop& l = m_L[li];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepLoop m_brep or m_loop_index back pointers.\n",
      bCorrupt,
      this, &l.m_brep,
      li, l.m_loop_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepLoop.m_ti[] index.\n",
      bCorrupt,
      T_count,
      l.m_ti
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepLoop.m_fi index.\n",
      bCorrupt,
      F_count,
      l.m_fi
    );
  }
  
  for (int fi = 0; fi < F_count; fi++)
  {
    const ON_BrepFace& f = m_F[fi];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepFace m_brep or m_face_index back pointers.\n",
      bCorrupt,
      this, &f.m_brep,
      fi, f.m_face_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepFace.m_li[] index.\n",
      bCorrupt,
      L_count,
      f.m_li
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepFace.m_si index.\n",
      bCorrupt,
      S_count,
      f.m_si
    );
  }

  return bCorrupt;
}